

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O3

void __thiscall
Diffusion::diffuse_velocity
          (Diffusion *this,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab *delta_rhs,int rhsComp,MultiFab **betan,MultiFab *betanCC,MultiFab **betanp1,
          MultiFab *betanp1CC,int betaComp)

{
  ostringstream *poVar1;
  char local_1e9;
  MultiFab **local_1e8;
  int local_1e0;
  int local_1dc;
  double local_1d8;
  Real local_1d0;
  Real local_1c8;
  MultiFab *local_1c0;
  Print local_1b8;
  
  local_1e8 = betan;
  local_1e0 = rho_flag;
  local_1dc = rhsComp;
  local_1d0 = dt;
  local_1c8 = be_cn_theta;
  local_1c0 = delta_rhs;
  if (verbose != 0) {
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00816950 + -0x30);
    poVar1 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"... Diffusion::diffuse_velocity() lev: ",0x27);
    std::ostream::operator<<(poVar1,this->level);
    std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    amrex::Print::~Print(&local_1b8);
  }
  local_1d8 = amrex::ParallelDescriptor::second();
  diffuse_tensor_velocity
            (this,local_1d0,local_1c8,rho_half,local_1e0,local_1c0,local_1dc,local_1e8,betanCC,
             betanp1,betanp1CC,betaComp);
  if (verbose != 0) {
    local_1e8 = (MultiFab **)amrex::ParallelDescriptor::second();
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00816950 + -0x30);
    poVar1 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Diffusion::diffuse_velocity(): lev: ",0x24);
    std::ostream::operator<<(poVar1,this->level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", time: ",8);
    std::ostream::_M_insert<double>((double)local_1e8 - local_1d8);
    local_1e9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1e9,1);
    amrex::Print::~Print(&local_1b8);
  }
  return;
}

Assistant:

void
Diffusion::diffuse_velocity (Real                   dt,
                             Real                   be_cn_theta,
                             const MultiFab&        rho_half,
                             int                    rho_flag,
                             MultiFab*              delta_rhs,
                             int                    rhsComp,
                             const MultiFab* const* betan,
                             const MultiFab* const  betanCC,
                             const MultiFab* const* betanp1,
                             const MultiFab* const  betanp1CC,
                             int                    betaComp)
{
  if (verbose) amrex::Print() << "... Diffusion::diffuse_velocity() lev: " << level << std::endl;

    const Real strt_time = ParallelDescriptor::second();

    diffuse_tensor_velocity(dt,be_cn_theta,rho_half,rho_flag,
                            delta_rhs,rhsComp,betan,betanCC,betanp1,betanp1CC,betaComp);

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "Diffusion::diffuse_velocity(): lev: " << level
                       << ", time: " << run_time << '\n';
    }
}